

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2predicates.cc
# Opt level: O2

int s2pred::TriageCompareEdgeDistance<double>
              (Vector3<double> *x,Vector3<double> *a0,Vector3<double> *a1,double r2)

{
  int iVar1;
  int iVar2;
  int iVar3;
  double dVar4;
  FloatType FVar5;
  FloatType FVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  Vector3<double> m;
  Vector3<double> local_a8;
  double local_88;
  double dStack_80;
  double local_78;
  double local_68;
  double dStack_60;
  double local_58;
  D local_48;
  
  dVar9 = a0->c_[1] - a1->c_[1];
  dVar10 = a0->c_[2] - a1->c_[2];
  dVar11 = a0->c_[1] + a1->c_[1];
  dVar4 = a0->c_[0] - a1->c_[0];
  dVar7 = a1->c_[2] + a0->c_[2];
  dVar8 = a1->c_[0] + a0->c_[0];
  local_a8.c_[0] = dVar9 * dVar7 - dVar10 * dVar11;
  local_a8.c_[1] = dVar10 * dVar8 - dVar4 * dVar7;
  local_a8.c_[2] = dVar4 * dVar11 - dVar8 * dVar9;
  Vector3<double>::CrossProd(&local_a8,x);
  local_58 = a0->c_[2] - x->c_[2];
  local_68 = a0->c_[0] - x->c_[0];
  dStack_60 = a0->c_[1] - x->c_[1];
  local_78 = a1->c_[2] - x->c_[2];
  local_88 = a1->c_[0] - x->c_[0];
  dStack_80 = a1->c_[1] - x->c_[1];
  dVar4 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::DotProd
                    ((BasicVector<Vector3,_double,_3UL> *)&local_68,&local_48);
  dVar7 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::DotProd
                    ((BasicVector<Vector3,_double,_3UL> *)&local_88,&local_48);
  dVar8 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::Norm2
                    ((BasicVector<Vector3,_double,_3UL> *)&local_a8);
  if (dVar8 < 0.0) {
    dVar9 = sqrt(dVar8);
  }
  else {
    dVar9 = SQRT(dVar8);
  }
  dVar10 = (dVar9 * 8.118802153517006 + 6.153480596427404e-15) * 1.1102230246251565e-16;
  FVar5 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::Norm
                    ((BasicVector<Vector3,_double,_3UL> *)&local_68);
  FVar6 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::Norm
                    ((BasicVector<Vector3,_double,_3UL> *)&local_88);
  if ((ABS(dVar4) < FVar5 * dVar10) || (ABS(dVar7) < FVar6 * dVar10)) {
    iVar1 = TriageCompareDistance<double>(x,a0,r2);
    iVar2 = TriageCompareDistance<double>(x,a1,r2);
    if (iVar2 < iVar1) {
      iVar1 = iVar2;
    }
    iVar3 = TriageCompareLineDistance<double>(x,a0,a1,r2,&local_a8,dVar9,dVar8);
    iVar2 = 0;
    if (iVar1 == iVar3) {
      iVar2 = iVar3;
    }
  }
  else if ((0.0 <= dVar4) || (dVar7 <= 0.0)) {
    iVar2 = TriageCompareDistance<double>(x,a0,r2);
    iVar1 = TriageCompareDistance<double>(x,a1,r2);
    if (iVar1 < iVar2) {
      iVar2 = iVar1;
    }
  }
  else {
    iVar2 = TriageCompareLineDistance<double>(x,a0,a1,r2,&local_a8,dVar9,dVar8);
  }
  return iVar2;
}

Assistant:

int TriageCompareEdgeDistance(const Vector3<T>& x, const Vector3<T>& a0,
                              const Vector3<T>& a1, T r2) {
  constexpr T T_ERR = rounding_epsilon<T>();

  // First we need to decide whether the closest point is an edge endpoint or
  // somewhere in the interior.  To determine this we compute a plane
  // perpendicular to (a0, a1) that passes through X.  Letting M be the normal
  // to this plane, the closest point is in the edge interior if and only if
  // a0.M < 0 and a1.M > 0.  Note that we can use "<" rather than "<=" because
  // if a0.M or a1.M is zero exactly then it doesn't matter which code path we
  // follow (since the distance to an endpoint and the distance to the edge
  // interior are exactly the same in this case).
  Vector3<T> n = (a0 - a1).CrossProd(a0 + a1);
  Vector3<T> m = n.CrossProd(x);
  // For better accuracy when the edge (a0,a1) is very short, we subtract "x"
  // before computing the dot products with M.
  Vector3<T> a0_dir = a0 - x;
  Vector3<T> a1_dir = a1 - x;
  T a0_sign = a0_dir.DotProd(m);
  T a1_sign = a1_dir.DotProd(m);
  T n2 = n.Norm2();
  T n1 = sqrt(n2);
  T n1_error = ((3.5 + 8 / sqrt(3)) * n1 + 32 * sqrt(3) * DBL_ERR) * T_ERR;
  T a0_sign_error = n1_error * a0_dir.Norm();
  T a1_sign_error = n1_error * a1_dir.Norm();
  if (fabs(a0_sign) < a0_sign_error || fabs(a1_sign) < a1_sign_error) {
    // It is uncertain whether minimum distance is to an edge vertex or to the
    // edge interior.  We handle this by computing both distances and checking
    // whether they yield the same result.
    int vertex_sign = min(TriageCompareDistance(x, a0, r2),
                          TriageCompareDistance(x, a1, r2));
    int line_sign = TriageCompareLineDistance(x, a0, a1, r2, n, n1, n2);
    return (vertex_sign == line_sign) ? line_sign : 0;
  }
  if (a0_sign >= 0 || a1_sign <= 0) {
    // The minimum distance is to an edge endpoint.
    return min(TriageCompareDistance(x, a0, r2),
               TriageCompareDistance(x, a1, r2));
  } else {
    // The minimum distance is to the edge interior.
    return TriageCompareLineDistance(x, a0, a1, r2, n, n1, n2);
  }
}